

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strlcpy.c
# Opt level: O3

unsigned_long strlcpy(char *dst,char *src,size_t siz)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  char *s;
  long lVar4;
  char *d;
  
  pcVar2 = src;
  if (1 < siz) {
    lVar4 = siz - 1;
    do {
      cVar1 = *pcVar2;
      pcVar2 = pcVar2 + 1;
      *dst = cVar1;
      if (cVar1 == '\0') goto LAB_0011371c;
      dst = dst + 1;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  pcVar3 = pcVar2;
  if (siz != 0) {
    *dst = '\0';
  }
  do {
    pcVar2 = pcVar3 + 1;
    cVar1 = *pcVar3;
    pcVar3 = pcVar2;
  } while (cVar1 != '\0');
LAB_0011371c:
  return (unsigned_long)(pcVar2 + ~(ulong)src);
}

Assistant:

size_t
strlcpy(char *dst, const char *src, size_t siz)
{
	char *d = dst;
	const char *s = src;
	size_t n = siz;

	_DIAGASSERT(dst != NULL);
	_DIAGASSERT(src != NULL);

	/* Copy as many bytes as will fit */
	if (n != 0 && --n != 0) {
		do {
			if ((*d++ = *s++) == 0)
				break;
		} while (--n != 0);
	}

	/* Not enough room in dst, add NUL and traverse rest of src */
	if (n == 0) {
		if (siz != 0)
			*d = '\0';		/* NUL-terminate dst */
		while (*s++)
			;
	}

	return(s - src - 1);	/* count does not include NUL */
}